

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrape.c
# Opt level: O3

course_results * scrape_html(char *html)

{
  int iVar1;
  course_results *__ptr;
  int *piVar2;
  course_strings *pcVar3;
  course_strings *pcVar4;
  course_strings *pcVar5;
  course_strings *pcVar6;
  course_strings *pcVar7;
  course_strings *pcVar8;
  course_strings *data;
  course_strings course_data;
  size_t i;
  course_strings *local_e8;
  course_strings *local_e0;
  course_strings *local_d8;
  course_strings *local_d0;
  course_strings *local_c8;
  undefined1 local_c0 [24];
  undefined1 local_a8 [64];
  undefined1 local_68 [16];
  char *local_58;
  char *local_50;
  course *local_48;
  course_strings *local_40;
  char *local_38;
  
  __ptr = (course_results *)malloc(0x10);
  if (__ptr != (course_results *)0x0) {
    __ptr->length = 0;
    local_48 = (course *)malloc(0x208);
    __ptr->courses = local_48;
    if (local_48 != (course *)0x0) {
      local_38 = (char *)0x0;
      if (*html != '\0') {
        data = (course_strings *)local_c0;
        do {
          local_c0._0_8_ =
               find_next(html,(size_t *)&stack0xffffffffffffffc8,"_lnkbtn_courseTitle",0x12,'>','<')
          ;
          if ((char *)local_c0._0_8_ == (char *)0x0) goto LAB_00105c41;
          local_c0._16_8_ =
               find_next(html,(size_t *)&stack0xffffffffffffffc8,"<b>Instructor:",0xd,'>','<');
          local_c8 = data;
          if ((char *)local_c0._16_8_ == (char *)0x0) {
LAB_00105c39:
            free(local_c8->course_name);
LAB_00105c41:
            free(local_48);
            free(__ptr);
            piVar2 = __errno_location();
            *piVar2 = -0x69;
            return (course_results *)0x0;
          }
          local_a8._0_8_ = find_next(html,(size_t *)&stack0xffffffffffffffc8,"<b>Units:",8,'>','<');
          if ((char *)local_a8._0_8_ == (char *)0x0) {
            local_c8 = (course_strings *)(local_c0 + 0x10);
LAB_00105c2e:
            free(data->course_name);
            goto LAB_00105c39;
          }
          local_a8._8_8_ =
               find_next(html,(size_t *)&stack0xffffffffffffffc8,"<b>Max Enroll</b>",0x10,':','<');
          if ((char *)local_a8._8_8_ == (char *)0x0) {
            local_e8 = (course_strings *)(local_c0 + 0x10);
            local_c8 = (course_strings *)local_a8;
LAB_00105c20:
            free(data->course_name);
            data = local_e8;
            goto LAB_00105c2e;
          }
          local_a8._16_8_ =
               find_next(html,(size_t *)&stack0xffffffffffffffc8,"<b>Prerequisities:",0x11,'>','<');
          if ((char *)local_a8._16_8_ == (char *)0x0) {
            pcVar7 = (course_strings *)(local_c0 + 0x10);
            local_e8 = (course_strings *)local_a8;
            local_c8 = (course_strings *)(local_a8 + 8);
LAB_00105c0f:
            free(data->course_name);
            data = pcVar7;
            goto LAB_00105c20;
          }
          local_a8._24_8_ =
               find_next(html,(size_t *)&stack0xffffffffffffffc8,"<b>Final Exam:",0xd,'>','\n');
          if ((char *)local_a8._24_8_ == (char *)0x0) {
            local_d8 = (course_strings *)(local_c0 + 0x10);
            pcVar7 = (course_strings *)local_a8;
            local_e8 = (course_strings *)(local_a8 + 8);
            local_c8 = (course_strings *)(local_a8 + 0x10);
LAB_00105bfb:
            free(data->course_name);
            data = local_d8;
            goto LAB_00105c0f;
          }
          local_a8._32_8_ = find_next(html,(size_t *)&stack0xffffffffffffffc8,"<td",3,'>','<');
          if ((char *)local_a8._32_8_ == (char *)0x0) {
            pcVar6 = (course_strings *)(local_c0 + 0x10);
            local_d8 = (course_strings *)local_a8;
            pcVar7 = (course_strings *)(local_a8 + 8);
            local_e8 = (course_strings *)(local_a8 + 0x10);
            local_c8 = (course_strings *)(local_a8 + 0x18);
LAB_00105bdf:
            free(data->course_name);
            data = pcVar6;
            goto LAB_00105bfb;
          }
          local_a8._40_8_ = find_next(html,(size_t *)&stack0xffffffffffffffc8,"<td",3,'>','<');
          if ((char *)local_a8._40_8_ == (char *)0x0) {
            pcVar5 = (course_strings *)(local_c0 + 0x10);
            pcVar6 = (course_strings *)local_a8;
            local_d8 = (course_strings *)(local_a8 + 8);
            pcVar7 = (course_strings *)(local_a8 + 0x10);
            local_e8 = (course_strings *)(local_a8 + 0x18);
            local_c8 = (course_strings *)(local_a8 + 0x20);
LAB_00105bbd:
            free(data->course_name);
            data = pcVar5;
            goto LAB_00105bdf;
          }
          local_a8._48_8_ = find_next(html,(size_t *)&stack0xffffffffffffffc8,"<td",3,'<','>');
          if ((char *)local_a8._48_8_ == (char *)0x0) {
            pcVar4 = (course_strings *)(local_c0 + 0x10);
            pcVar5 = (course_strings *)local_a8;
            pcVar6 = (course_strings *)(local_a8 + 8);
            local_d8 = (course_strings *)(local_a8 + 0x10);
            pcVar7 = (course_strings *)(local_a8 + 0x18);
            local_d0 = (course_strings *)(local_a8 + 0x20);
            local_c8 = (course_strings *)(local_a8 + 0x28);
LAB_00105b94:
            free(data->course_name);
            local_e8 = local_d0;
            data = pcVar4;
            goto LAB_00105bbd;
          }
          local_a8._56_8_ =
               find_next(html,(size_t *)&stack0xffffffffffffffc8,"_lbl_seeDetails",0xe,'>','<');
          if ((char *)local_a8._56_8_ == (char *)0x0) {
            pcVar3 = (course_strings *)(local_c0 + 0x10);
            pcVar4 = (course_strings *)local_a8;
            pcVar5 = (course_strings *)(local_a8 + 8);
            local_d8 = (course_strings *)(local_a8 + 0x10);
            local_e0 = (course_strings *)(local_a8 + 0x28);
            local_c8 = (course_strings *)(local_a8 + 0x30);
            pcVar7 = (course_strings *)(local_a8 + 0x20);
            local_e8 = (course_strings *)(local_a8 + 0x18);
LAB_00105b66:
            pcVar6 = local_d8;
            free(data->course_name);
            local_d8 = local_e8;
            local_d0 = local_e0;
            data = pcVar3;
            goto LAB_00105b94;
          }
          local_68._0_8_ =
               find_next(html,(size_t *)&stack0xffffffffffffffc8,"<font size=1",0xb,'>','<');
          if ((char *)local_68._0_8_ == (char *)0x0) {
            local_c8 = (course_strings *)(local_a8 + 0x38);
            pcVar3 = (course_strings *)(local_c0 + 0x10);
            pcVar4 = (course_strings *)local_a8;
            pcVar5 = (course_strings *)(local_a8 + 8);
            local_d8 = (course_strings *)(local_a8 + 0x10);
            local_e8 = (course_strings *)(local_a8 + 0x18);
            pcVar7 = (course_strings *)(local_a8 + 0x20);
            local_e0 = (course_strings *)(local_a8 + 0x28);
            goto LAB_00105b66;
          }
          local_68._8_8_ = find_next(html,(size_t *)&stack0xffffffffffffffc8,"<td",3,'>','<');
          if ((char *)local_68._8_8_ == (char *)0x0) {
            pcVar6 = (course_strings *)(local_c0 + 0x10);
            pcVar3 = (course_strings *)local_a8;
            pcVar4 = (course_strings *)(local_a8 + 8);
            local_d8 = (course_strings *)(local_a8 + 0x10);
            local_e8 = (course_strings *)(local_a8 + 0x18);
            pcVar8 = (course_strings *)(local_a8 + 0x20);
            local_e0 = (course_strings *)(local_a8 + 0x28);
            local_d0 = (course_strings *)(local_a8 + 0x38);
            local_c8 = (course_strings *)local_68;
LAB_00105b2f:
            pcVar5 = local_d8;
            free(data->course_name);
            local_d8 = local_e8;
            pcVar7 = local_e0;
            data = pcVar6;
            local_e8 = pcVar8;
            local_e0 = local_d0;
            goto LAB_00105b66;
          }
          local_58 = find_next(html,(size_t *)&stack0xffffffffffffffc8,"<td",3,'>','<');
          if (local_58 == (char *)0x0) {
            local_40 = (course_strings *)(local_68 + 8);
            pcVar7 = (course_strings *)(local_c0 + 0x10);
            pcVar6 = (course_strings *)local_a8;
            pcVar3 = (course_strings *)(local_a8 + 8);
            local_d8 = (course_strings *)(local_a8 + 0x10);
            local_e8 = (course_strings *)(local_a8 + 0x18);
            pcVar5 = (course_strings *)(local_a8 + 0x20);
            local_e0 = (course_strings *)(local_a8 + 0x28);
            local_d0 = (course_strings *)(local_a8 + 0x38);
            local_c8 = (course_strings *)local_68;
LAB_00105aeb:
            pcVar4 = local_d8;
            pcVar8 = local_e0;
            free(data->course_name);
            local_d8 = local_e8;
            local_e0 = local_d0;
            local_d0 = local_c8;
            local_c8 = local_40;
            data = pcVar7;
            local_e8 = pcVar5;
            goto LAB_00105b2f;
          }
          local_50 = find_next(html,(size_t *)&stack0xffffffffffffffc8,"<td",3,'>','<');
          if (local_50 == (char *)0x0) {
            free((void *)local_c0._0_8_);
            data = (course_strings *)(local_c0 + 0x10);
            pcVar7 = (course_strings *)local_a8;
            pcVar6 = (course_strings *)(local_a8 + 8);
            pcVar3 = (course_strings *)(local_a8 + 0x10);
            local_d8 = (course_strings *)(local_a8 + 0x18);
            local_e8 = (course_strings *)(local_a8 + 0x20);
            pcVar5 = (course_strings *)(local_a8 + 0x28);
            local_e0 = (course_strings *)(local_a8 + 0x38);
            local_d0 = (course_strings *)local_68;
            local_c8 = (course_strings *)(local_68 + 8);
            local_40 = (course_strings *)&stack0xffffffffffffffa8;
            goto LAB_00105aeb;
          }
          iVar1 = create_course(local_48 + __ptr->length,data);
          if (iVar1 != 0) goto LAB_00105c41;
        } while (html[(long)local_38] != '\0');
      }
      __ptr->courses = (course *)0x0;
      __ptr->length = 0;
      return __ptr;
    }
    free(__ptr);
  }
  return (course_results *)0x0;
}

Assistant:

struct course_results *scrape_html(const char *html)
{
	struct course_results *results;
	size_t capacity;
	size_t i;
	int ret;

	results = init_course_results(&capacity);
	if (!results) {
		return NULL;
	}

	i = 0;
	while (html[i]) {
		struct course_strings course_data;
		struct course *course;

		if (results->length + 1 >= capacity) {
			resize_course_results(results, &capacity);
		}

		ret = read_course_data(&course_data, html, &i);
		if (ret) {
			destroy_course_results(results);
			errno = UCRCOURSE_ERR_RESPONSE;
			return NULL;
		}

		course = (struct course *)(&results->courses[results->length]);
		ret = create_course(course, &course_data);
		if (ret) {
			destroy_course_results(results);
			errno = UCRCOURSE_ERR_RESPONSE;
			return NULL;
		}
	}

	/* TEMP */
	results->courses = NULL;
	results->length = 0;

	return results;
}